

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O3

ssize_t __thiscall SID::read(SID *this,int __fd,void *__buf,size_t __nbytes)

{
  reg8 rVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  switch(__fd) {
  case 0x19:
    rVar1 = Potentiometer::readPOT((Potentiometer *)&this->field_0x4224);
    return CONCAT44(extraout_var,rVar1);
  case 0x1a:
    rVar1 = Potentiometer::readPOT((Potentiometer *)&this->field_0x4225);
    return CONCAT44(extraout_var_02,rVar1);
  case 0x1b:
    rVar1 = WaveformGenerator::readOSC((WaveformGenerator *)&this->field_0x120);
    return CONCAT44(extraout_var_00,rVar1);
  case 0x1c:
    rVar1 = EnvelopeGenerator::readENV((EnvelopeGenerator *)&this->field_0x178);
    return CONCAT44(extraout_var_01,rVar1);
  default:
    return (ulong)this->bus_value;
  }
}

Assistant:

reg8 SID::read(reg8 offset)
{
  switch (offset) {
  case 0x19:
    return potx.readPOT();
  case 0x1a:
    return poty.readPOT();
  case 0x1b:
    return voice[2].wave.readOSC();
  case 0x1c:
    return voice[2].envelope.readENV();
  default:
    return bus_value;
  }
}